

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::PrintStats(ScriptContext *this)

{
  RegexStatsDatabase *this_00;
  double dVar1;
  double dVar2;
  anon_class_88_11_04ad8b93_for_mapper mapper;
  uint uVar3;
  OpCode OVar4;
  uint uVar5;
  bool bVar6;
  ArenaAllocator *allocator;
  Recycler *this_01;
  char16 *pcVar7;
  DebugWriter *w;
  ThreadContext *pTVar8;
  size_t sVar9;
  ulong uVar10;
  undefined1 local_444 [8];
  FieldAccessStats globalStats;
  uint i_1;
  WCHAR local_3f8 [4];
  WCHAR buf [256];
  uint local_1f0;
  uint totalRejits;
  uint totalBailouts;
  uint i;
  uint high;
  uint low;
  long lStack_1d8;
  uint *local_1d0;
  uint *puStack_1c8;
  uint *local_1c0;
  int *piStack_1b8;
  uint *local_1b0;
  uint *puStack_1a8;
  uint *local_1a0;
  uint *puStack_198;
  uint *local_190;
  FunctionBody *local_180;
  FunctionBody *anyFunctionBody;
  uint local_170;
  uint nonZeroBytecodeFunctions;
  uint oneInterpretedFunctions;
  uint zeroInterpretedFunctions;
  uint rejits [15];
  uint usedNativeCodeBuckets [15];
  uint nativeCodeBuckets [15];
  uint totalBuckets [15];
  uint local_60;
  int local_5c;
  uint size1CutOffbucketId;
  uint bucketSize2;
  uint bucketSize1;
  uint loopJitCodeUsed;
  double pct;
  int iStack_40;
  OpCode j_2;
  int j_1;
  int index;
  uint upper;
  double pctcume;
  uint max;
  int j;
  uint unique;
  uint total;
  ScriptContext *this_local;
  
  _unique = this;
  if ((DAT_01ebb8a1 & 1) != 0) {
    ProfileTypes(this);
  }
  if ((DAT_01ebb8a3 & 1) != 0) {
    Output::Print(L"CodeSize: %6d\nBailOutRecord Size: %6d\nLocalOffsets Size: %6d\n",this->codeSize
                  ,this->bailOutRecordBytes,this->bailOutOffsetBytes);
  }
  if ((DAT_01ebb894 & 1) != 0) {
    ProfileObjectLiteral(this);
  }
  if (this->stringProfiler != (StringProfiler *)0x0) {
    StringProfiler::PrintAll(this->stringProfiler);
    allocator = MiscAllocator(this);
    Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::StringProfiler>
              (allocator,this->stringProfiler);
    this->stringProfiler = (StringProfiler *)0x0;
  }
  if (((this->profileMemoryDump & 1U) != 0) &&
     (bVar6 = MemoryProfiler::IsTraceEnabled(false), bVar6)) {
    MemoryProfiler::PrintAll();
    bVar6 = Phases::IsEnabled((Phases *)&DAT_01ec4520,AllPhase);
    if ((bVar6) || (bVar6 = Phases::IsEnabled((Phases *)&DAT_01ec4520,RunPhase), bVar6)) {
      this_01 = GetRecycler(this);
      Memory::Recycler::PrintAllocStats(this_01);
    }
  }
  bVar6 = Phases::IsEnabled((Phases *)&DAT_01ebe7c8,ByteCodePhase);
  if (bVar6) {
    Output::Print(L" Total Bytecode size: <%d, %d, %d> = %d\n",(ulong)this->byteCodeDataSize,
                  (ulong)this->byteCodeAuxiliaryDataSize,
                  (ulong)this->byteCodeAuxiliaryContextDataSize,
                  (ulong)(this->byteCodeDataSize + this->byteCodeAuxiliaryDataSize +
                         this->byteCodeAuxiliaryContextDataSize));
  }
  if ((DAT_01e9e308 & 1) != 0) {
    Output::Print(L"ByteCode Histogram\n");
    Output::Print(L"\n");
    j = 0;
    max = 0;
    for (pctcume._4_4_ = 0; pctcume._4_4_ < 0x189; pctcume._4_4_ = pctcume._4_4_ + 1) {
      j = this->byteCodeHistogram[pctcume._4_4_] + j;
      if (this->byteCodeHistogram[pctcume._4_4_] != 0) {
        max = max + 1;
      }
    }
    Output::Print(L"%9u                     Total executed ops\n");
    Output::Print(L"\n");
    pctcume._0_4_ = 0xffffffff;
    _index = 0.0;
    while( true ) {
      j_1 = 0;
      iStack_40 = -1;
      for (pct._4_4_ = 0; pct._4_4_ < 0x189; pct._4_4_ = pct._4_4_ + 1) {
        bVar6 = OpCodeUtil::IsValidOpcode((OpCode)pct._4_4_);
        if (((bVar6) && ((uint)j_1 < this->byteCodeHistogram[pct._4_4_])) &&
           (this->byteCodeHistogram[pct._4_4_] < pctcume._0_4_)) {
          iStack_40 = pct._4_4_;
          j_1 = this->byteCodeHistogram[pct._4_4_];
        }
      }
      if (iStack_40 == -1) break;
      pctcume._0_4_ = this->byteCodeHistogram[iStack_40];
      pct._2_2_ = EndOfBlock;
      while (pct._2_2_ < ByteCodeLast) {
        bVar6 = OpCodeUtil::IsValidOpcode(pct._2_2_);
        uVar5 = pctcume._0_4_;
        OVar4 = pct._2_2_;
        if ((bVar6) && (pctcume._0_4_ == this->byteCodeHistogram[(int)(uint)pct._2_2_])) {
          _bucketSize1 = (double)pctcume._0_4_ / (double)(uint)j;
          _index = _bucketSize1 + _index;
          dVar1 = _bucketSize1 * 100.0;
          dVar2 = _index * 100.0;
          pcVar7 = OpCodeUtil::GetOpCodeName(pct._2_2_);
          Output::Print(L"%9u  %5.1lf  %5.1lf  %04x %s\n",SUB84(dVar1,0),SUB84(dVar2,0),(ulong)uVar5
                        ,(ulong)OVar4,pcVar7);
        }
        Js::operator++((OpCode *)((long)&pct + 2),0);
      }
    }
    Output::Print(L"\n");
    Output::Print(L"Unique opcodes: %d\n",(ulong)max);
  }
  bVar6 = Phases::IsEnabled((Phases *)&DAT_01ebe7c8,BGJitPhase);
  if ((bVar6) &&
     ((0x32 < this->interpretedCount ||
      (bVar6 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ForceFlag),
      bVar6)))) {
    bucketSize2 = 0;
    size1CutOffbucketId = 0x14;
    local_5c = 100;
    local_60 = 4;
    memset(nativeCodeBuckets + 0xe,0,0x3c);
    memset(usedNativeCodeBuckets + 0xe,0,0x3c);
    memset(rejits + 0xe,0,0x3c);
    memset(&oneInterpretedFunctions,0,0x3c);
    nonZeroBytecodeFunctions = 0;
    local_170 = 0;
    anyFunctionBody._4_4_ = 0;
    Output::Print(L"Script Context: 0x%p Url: %s\n",this,this->url);
    local_180 = FindFunction<Js::ScriptContext::PrintStats()::__0>(this);
    if (local_180 != (FunctionBody *)0x0) {
      if ((DAT_01ec73ca & 1) != 0) {
        Output::TraceStats(BGJitPhase,L"Function list\n");
      }
      if ((DAT_01ec73ca & 1) != 0) {
        Output::TraceStats(BGJitPhase,L"===============================\n");
      }
      if ((DAT_01ec73ca & 1) != 0) {
        Output::TraceStats(BGJitPhase,L"%-24s, %-8s, %-10s, %-10s, %-10s, %-10s, %-10s\n",
                           L"Function",L"InterpretedCount",L"ByteCodeInLoopSize",L"ByteCodeSize",
                           0x186e360,0x186e372,0x186e380);
      }
      _high = &nonZeroBytecodeFunctions;
      lStack_1d8 = (long)&anyFunctionBody + 4;
      local_1d0 = &local_170;
      puStack_1c8 = &size1CutOffbucketId;
      local_1c0 = &local_60;
      piStack_1b8 = &local_5c;
      local_1b0 = nativeCodeBuckets + 0xe;
      puStack_1a8 = usedNativeCodeBuckets + 0xe;
      local_1a0 = rejits + 0xe;
      puStack_198 = &oneInterpretedFunctions;
      local_190 = &bucketSize2;
      mapper.nonZeroBytecodeFunctions._0_4_ = (int)lStack_1d8;
      mapper.zeroInterpretedFunctions = _high;
      mapper.nonZeroBytecodeFunctions._4_4_ = (int)((ulong)lStack_1d8 >> 0x20);
      mapper.oneInterpretedFunctions._0_4_ = (int)local_1d0;
      mapper.oneInterpretedFunctions._4_4_ = (int)((ulong)local_1d0 >> 0x20);
      mapper.bucketSize1._0_4_ = (int)puStack_1c8;
      mapper.bucketSize1._4_4_ = (int)((ulong)puStack_1c8 >> 0x20);
      mapper.size1CutOffbucketId._0_4_ = (int)local_1c0;
      mapper.size1CutOffbucketId._4_4_ = (int)((ulong)local_1c0 >> 0x20);
      mapper.bucketSize2 = (uint *)piStack_1b8;
      mapper.totalBuckets = (uint (*) [15])local_1b0;
      mapper.nativeCodeBuckets = (uint (*) [15])puStack_1a8;
      mapper.usedNativeCodeBuckets = (uint (*) [15])local_1a0;
      mapper.rejits = (uint (*) [15])puStack_198;
      mapper.loopJitCodeUsed = local_190;
      MapFunction<Js::ScriptContext::PrintStats()::__1>(this,mapper);
    }
    Output::Print(L"**  SpeculativelyJitted: %6d FunctionsJitted: %6d JittedUsed: %6d Usage:%f ByteCodesJitted: %6d JitCodeUsed: %6d Usage: %f \n"
                  ,SUB84((double)(((float)this->funcJitCodeUsed / (float)this->funcJITCount) * 100.0
                                 ),0),
                  SUB84((double)(((float)this->jitCodeUsed / (float)this->bytecodeJITCount) * 100.0)
                        ,0),(ulong)this->speculativeJitCount,(ulong)this->funcJITCount,
                  (ulong)this->funcJitCodeUsed,(ulong)this->bytecodeJITCount,
                  (ulong)this->jitCodeUsed);
    Output::Print(L"** LoopJITCount: %6d LoopJitCodeUsed: %6d Usage: %f\n",
                  SUB84((double)(((float)bucketSize2 / (float)this->loopJITCount) * 100.0),0),
                  (ulong)this->loopJITCount,(ulong)bucketSize2);
    Output::Print(L"** TotalInterpretedCalls: %6d MaxFuncInterp: %6d  InterpretedHighPri: %6d \n",
                  (ulong)this->interpretedCount,(ulong)this->maxFuncInterpret,
                  (ulong)this->interpretedCallsHighPri);
    Output::Print(L"** ZeroInterpretedFunctions: %6d OneInterpretedFunctions: %6d ZeroInterpretedWithNonZeroBytecode: %6d \n "
                  ,(ulong)nonZeroBytecodeFunctions,(ulong)local_170,(ulong)anyFunctionBody._4_4_);
    Output::Print(L"** %-24s : %-10s %-10s %-10s %-10s %-10s\n",L"InterpretedCounts",L"Total",
                  L"NativeCode",L"Used",L"Usage",0x186e6e4);
    i = 0;
    totalBailouts = 0;
    for (totalRejits = 0; uVar3 = totalBailouts, totalRejits < 0xf; totalRejits = totalRejits + 1) {
      i = totalBailouts;
      if (local_60 < totalRejits) {
        if (totalRejits < 0xe) {
          totalBailouts = totalBailouts + local_5c;
        }
        else {
          totalBailouts = 100000;
        }
      }
      else {
        totalBailouts = totalBailouts + size1CutOffbucketId;
      }
      uVar10 = (ulong)totalRejits;
      Output::Print(L"** %10d - %10d : %10d %10d %10d %7.2f %10d\n",
                    SUB84((double)(((float)rejits[uVar10 + 0xe] /
                                   (float)usedNativeCodeBuckets[uVar10 + 0xe]) * 100.0),0),
                    (ulong)uVar3,(ulong)totalBailouts,(ulong)nativeCodeBuckets[uVar10 + 0xe],
                    (ulong)usedNativeCodeBuckets[uVar10 + 0xe],(ulong)rejits[uVar10 + 0xe],
                    (&oneInterpretedFunctions)[totalRejits]);
    }
    Output::Print(L"\n\n");
  }
  bVar6 = Phases::IsEnabled((Phases *)&DAT_01ebe7c8,ReJITPhase);
  if (bVar6) {
    local_1f0 = 0;
    buf[0xfe] = L'\0';
    buf[0xff] = L'\0';
    Output::Print(L"%-40s %6s\n",L"Bailout Reason,",L"Count");
    JsUtil::
    BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::Map<Js::ScriptContext::PrintStats()::__2>
              ((BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->bailoutReasonCounts,(anon_class_8_1_7b55b90b_for_fn)&local_1f0);
    Output::Print(L"%-40s %6d\n",L"TOTAL,",(ulong)local_1f0);
    Output::Print(L"\n\n");
    Output::Print(L"%-40s %6s\n",L"Rejit Reason,",L"Count");
    for (globalStats.clonedPolyInlineCacheCount = 0; globalStats.clonedPolyInlineCacheCount < 0x2d;
        globalStats.clonedPolyInlineCacheCount = globalStats.clonedPolyInlineCacheCount + 1) {
      buf._508_4_ = this->rejitReasonCounts[globalStats.clonedPolyInlineCacheCount] + buf._508_4_;
      if (this->rejitReasonCounts[globalStats.clonedPolyInlineCacheCount] != 0) {
        swprintf_s<256ul>((WCHAR (*) [256])local_3f8,L"%S,",
                          RejitReasonNames[globalStats.clonedPolyInlineCacheCount]);
        Output::Print(L"%-40s %6d\n",local_3f8,
                      (ulong)this->rejitReasonCounts[globalStats.clonedPolyInlineCacheCount]);
      }
    }
    Output::Print(L"%-40s %6d\n",L"TOTAL,",(ulong)(uint)buf._508_4_);
    Output::Print(L"\n\n");
    if (((DAT_01ec73ca & 1) != 0) && (this->rejitStatsMap != (RejitStatsMap *)0x0)) {
      Output::Print(L"%-30s %14s %14s\n",L"Function (#),",L"Bailout Count,",L"Rejit Count");
      JsUtil::
      WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>
      ::Map<Js::ScriptContext::PrintStats()::__3>
                ((WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>
                  *)this->rejitStatsMap);
      Output::Print(L"\n\n");
      JsUtil::
      WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>
      ::Map<Js::ScriptContext::PrintStats()::__4>
                ((WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>
                  *)this->rejitStatsMap);
    }
  }
  ClearBailoutReasonCountsMap(this);
  ClearRejitReasonCountsArray(this);
  bVar6 = Phases::IsEnabled((Phases *)&DAT_01ebe7c8,ObjTypeSpecPhase);
  if (bVar6) {
    FieldAccessStats::FieldAccessStats((FieldAccessStats *)local_444);
    if (this->fieldAccessStatsByFunctionNumber != (FieldAccessStatsByFunctionNumberMap *)0x0) {
      JsUtil::
      BaseDictionary<unsigned_int,Js::ScriptContext::FieldAccessStatsEntry*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::Map<Js::ScriptContext::PrintStats()::__5>
                ((BaseDictionary<unsigned_int,Js::ScriptContext::FieldAccessStatsEntry*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->fieldAccessStatsByFunctionNumber,(FieldAccessStats *)local_444);
    }
    Output::Print(L"FieldAccessStats: totals\n");
    Output::Print(L"    overall: total %u, no profile info %u\n",(ulong)(uint)local_444._0_4_,
                  (ulong)(uint)local_444._4_4_);
    Output::Print(L"    mono: total %u, empty %u, cloned %u\n",
                  (ulong)globalStats.totalInlineCacheCount,(ulong)globalStats.noInfoInlineCacheCount
                  ,(ulong)globalStats.nonEquivPolyInlineCacheCount);
    Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                  ,(ulong)globalStats.monoInlineCacheCount,
                  (ulong)globalStats.emptyPolyInlineCacheCount,
                  (ulong)globalStats.ignoredPolyInlineCacheCount,
                  (ulong)globalStats.emptyMonoInlineCacheCount,
                  (ulong)globalStats.polyInlineCacheCount,globalStats.nullPolyInlineCacheCount,
                  globalStats.equivPolyInlineCacheCount,globalStats.highUtilPolyInlineCacheCount,
                  globalStats.lowUtilPolyInlineCacheCount,globalStats.disabledPolyInlineCacheCount);
  }
  bVar6 = Phases::IsEnabled((Phases *)&DAT_01ebe7c8,MissingPropertyCachePhase);
  if (bVar6) {
    Output::Print(L"MissingPropertyStats: hits = %d, misses = %d, cache attempts = %d.\n",
                  (ulong)(uint)this->missingPropertyHits,(ulong)(uint)this->missingPropertyMisses,
                  (ulong)(uint)this->missingPropertyCacheAttempts);
  }
  bVar6 = Phases::IsEnabled((Phases *)&DAT_01ebe7c8,PolymorphicInlineCachePhase);
  if (bVar6) {
    Output::Print(L"%s,%s,%s,%s,%s,%s,%s,%s,%s\n",L"Function",L"Property",L"Kind",L"Accesses",
                  L"Misses",0x186e93a,0x1836e1e,0x186e94e,0x186e96c);
    JsUtil::
    BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::Map<Js::ScriptContext::PrintStats()::__6>
              ((BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->cacheDataMap,(anon_class_8_1_8991fb9c_for_fn)this);
  }
  if (this->regexStatsDatabase != (RegexStatsDatabase *)0x0) {
    this_00 = this->regexStatsDatabase;
    w = GetRegexDebugWriter(this);
    UnifiedRegex::RegexStatsDatabase::Print(this_00,w);
  }
  Output::TraceStats(EmitterPhase,L"Script Context: 0x%p Url: %s\n",this,this->url);
  pTVar8 = GetThreadContext(this);
  sVar9 = ThreadContext::GetCodeSize(pTVar8);
  Output::TraceStats(EmitterPhase,L"  Total thread committed code size = %d\n",sVar9);
  Output::TraceStats(ParsePhase,L"Script Context: 0x%p Url: %s\n",this,this->url);
  pTVar8 = GetThreadContext(this);
  sVar9 = ThreadContext::GetSourceSize(pTVar8);
  Output::TraceStats(ParsePhase,L"  Total ThreadContext source size %d\n",sVar9);
  Output::Flush();
  return;
}

Assistant:

void ScriptContext::PrintStats()
    {

#ifdef PROFILE_TYPES
        if (Configuration::Global.flags.ProfileTypes)
        {
            ProfileTypes();
        }
#endif

#ifdef PROFILE_BAILOUT_RECORD_MEMORY
        if (Configuration::Global.flags.ProfileBailOutRecordMemory)
        {
            Output::Print(_u("CodeSize: %6d\nBailOutRecord Size: %6d\nLocalOffsets Size: %6d\n"), codeSize, bailOutRecordBytes, bailOutOffsetBytes);
        }
#endif

#ifdef PROFILE_OBJECT_LITERALS
        if (Configuration::Global.flags.ProfileObjectLiteral)
        {
            ProfileObjectLiteral();
        }
#endif

#ifdef PROFILE_STRINGS
        if (stringProfiler != nullptr)
        {
            stringProfiler->PrintAll();
            Adelete(MiscAllocator(), stringProfiler);
            stringProfiler = nullptr;
        }
#endif

#ifdef PROFILE_MEM
        if (profileMemoryDump && MemoryProfiler::IsTraceEnabled())
        {
            MemoryProfiler::PrintAll();
#ifdef PROFILE_RECYCLER_ALLOC
            if (Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::AllPhase)
                || Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::RunPhase))
            {
                GetRecycler()->PrintAllocStats();
            }
#endif
        }
#endif
#if DBG_DUMP
        if (PHASE_STATS1(Js::ByteCodePhase))
        {
            Output::Print(_u(" Total Bytecode size: <%d, %d, %d> = %d\n"),
                byteCodeDataSize,
                byteCodeAuxiliaryDataSize,
                byteCodeAuxiliaryContextDataSize,
                byteCodeDataSize + byteCodeAuxiliaryDataSize + byteCodeAuxiliaryContextDataSize);
        }

        if (Configuration::Global.flags.BytecodeHist)
        {
            Output::Print(_u("ByteCode Histogram\n"));
            Output::Print(_u("\n"));

            uint total = 0;
            uint unique = 0;
            for (int j = 0; j < (int)OpCode::ByteCodeLast; j++)
            {
                total += byteCodeHistogram[j];
                if (byteCodeHistogram[j] > 0)
                {
                    unique++;
                }
            }
            Output::Print(_u("%9u                     Total executed ops\n"), total);
            Output::Print(_u("\n"));

            uint max = UINT_MAX;
            double pctcume = 0.0;

            while (true)
            {
                uint upper = 0;
                int index = -1;
                for (int j = 0; j < (int)OpCode::ByteCodeLast; j++)
                {
                    if (OpCodeUtil::IsValidOpcode((OpCode)j) && byteCodeHistogram[j] > upper && byteCodeHistogram[j] < max)
                    {
                        index = j;
                        upper = byteCodeHistogram[j];
                    }
                }

                if (index == -1)
                {
                    break;
                }

                max = byteCodeHistogram[index];

                for (OpCode j = (OpCode)0; j < OpCode::ByteCodeLast; j++)
                {
                    if (OpCodeUtil::IsValidOpcode(j) && max == byteCodeHistogram[(int)j])
                    {
                        double pct = ((double)max) / total;
                        pctcume += pct;

                        Output::Print(_u("%9u  %5.1lf  %5.1lf  %04x %s\n"), max, pct * 100, pctcume * 100, j, OpCodeUtil::GetOpCodeName(j));
                    }
                }
            }
            Output::Print(_u("\n"));
            Output::Print(_u("Unique opcodes: %d\n"), unique);
        }

#endif

#if ENABLE_NATIVE_CODEGEN
#ifdef BGJIT_STATS
        // We do not care about small script contexts without much activity - unless t
        if (PHASE_STATS1(Js::BGJitPhase) && (this->interpretedCount > 50 || Js::Configuration::Global.flags.IsEnabled(Js::ForceFlag)))
        {

#define MAX_BUCKETS 15
            uint loopJitCodeUsed = 0;
            uint bucketSize1 = 20;
            uint bucketSize2 = 100;
            uint size1CutOffbucketId = 4;
            uint totalBuckets[MAX_BUCKETS] = { 0 };
            uint nativeCodeBuckets[MAX_BUCKETS] = { 0 };
            uint usedNativeCodeBuckets[MAX_BUCKETS] = { 0 };
            uint rejits[MAX_BUCKETS] = { 0 };
            uint zeroInterpretedFunctions = 0;
            uint oneInterpretedFunctions = 0;
            uint nonZeroBytecodeFunctions = 0;
            Output::Print(_u("Script Context: 0x%p Url: %s\n"), this, this->url);

            FunctionBody* anyFunctionBody = this->FindFunction([](FunctionBody* body) { return body != nullptr; });

            if (anyFunctionBody)
            {
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("Function list\n"));
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("===============================\n"));
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-24s, %-8s, %-10s, %-10s, %-10s, %-10s, %-10s\n"), _u("Function"), _u("InterpretedCount"), _u("ByteCodeInLoopSize"), _u("ByteCodeSize"), _u("IsJitted"), _u("IsUsed"), _u("NativeCodeSize"));

                this->MapFunction([&](FunctionBody* body)
                {
                    bool isNativeCode = false;

                    // Filtering interpreted count lowers a lot of noise
                    if (body->GetInterpretedCount() > 1 || Js::Configuration::Global.flags.IsEnabled(Js::ForceFlag))
                    {
                        body->MapEntryPoints([&](uint entryPointIndex, FunctionEntryPointInfo* entryPoint)
                        {
                            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                            char rejit = entryPointIndex > 0 ? '*' : ' ';
                            isNativeCode = entryPoint->IsNativeCode() | isNativeCode;
                            OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"),
                                body->GetExternalDisplayName(),
                                body->GetDebugNumberSet(debugStringBuffer),
                                rejit,
                                body->GetInterpretedCount(),
                                body->GetByteCodeInLoopCount(),
                                body->GetByteCodeCount(),
                                entryPoint->IsNativeCode() ? _u("Jitted") : _u("Interpreted"),
                                body->GetNativeEntryPointUsed() ? _u("Used") : _u("NotUsed"),
                                entryPoint->IsNativeCode() ? entryPoint->GetCodeSize() : 0);
                        });
                    }
                    if (body->GetInterpretedCount() == 0)
                    {
                        zeroInterpretedFunctions++;
                        if (body->GetByteCodeCount() > 0)
                        {
                            nonZeroBytecodeFunctions++;
                        }
                    }
                    else if (body->GetInterpretedCount() == 1)
                    {
                        oneInterpretedFunctions++;
                    }


                    // Generate a histogram using interpreted counts.
                    uint bucket;
                    uint intrpCount = body->GetInterpretedCount();
                    if (intrpCount < 100)
                    {
                        bucket = intrpCount / bucketSize1;
                    }
                    else if (intrpCount < 1000)
                    {
                        bucket = size1CutOffbucketId  + intrpCount / bucketSize2;
                    }
                    else
                    {
                        bucket = MAX_BUCKETS - 1;
                    }

                    // Explicitly assume that the bucket count is less than the following counts (which are all equal)
                    // This is because min will return MAX_BUCKETS - 1 if the count exceeds MAX_BUCKETS - 1.
                    __analysis_assume(bucket < MAX_BUCKETS);

                    totalBuckets[bucket]++;
                    if (isNativeCode)
                    {
                        nativeCodeBuckets[bucket]++;
                        if (body->GetNativeEntryPointUsed())
                        {
                            usedNativeCodeBuckets[bucket]++;
                        }
                        if (body->HasRejit())
                        {
                            rejits[bucket]++;
                        }
                    }

                    body->MapLoopHeaders([&](uint loopNumber, LoopHeader* header)
                    {
                        char16 loopBodyName[256];
                        body->GetLoopBodyName(loopNumber, loopBodyName, _countof(loopBodyName));
                        header->MapEntryPoints([&](int index, LoopEntryPointInfo * entryPoint)
                        {
                            if (entryPoint->IsNativeCode())
                            {
                                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                                char rejit = index > 0 ? '*' : ' ';
                                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"),
                                    loopBodyName,
                                    body->GetDebugNumberSet(debugStringBuffer),
                                    rejit,
                                    header->interpretCount,
                                    header->GetByteCodeCount(),
                                    header->GetByteCodeCount(),
                                    _u("Jitted"),
                                    entryPoint->IsUsed() ? _u("Used") : _u("NotUsed"),
                                    entryPoint->GetCodeSize());
                                if (entryPoint->IsUsed())
                                {
                                    loopJitCodeUsed++;
                                }
                            }
                        });
                    });
                });
            }

            Output::Print(_u("**  SpeculativelyJitted: %6d FunctionsJitted: %6d JittedUsed: %6d Usage:%f ByteCodesJitted: %6d JitCodeUsed: %6d Usage: %f \n"),
                speculativeJitCount, funcJITCount, funcJitCodeUsed, ((float)(funcJitCodeUsed) / funcJITCount) * 100, bytecodeJITCount, jitCodeUsed, ((float)(jitCodeUsed) / bytecodeJITCount) * 100);
            Output::Print(_u("** LoopJITCount: %6d LoopJitCodeUsed: %6d Usage: %f\n"),
                loopJITCount, loopJitCodeUsed, ((float)loopJitCodeUsed / loopJITCount) * 100);
            Output::Print(_u("** TotalInterpretedCalls: %6d MaxFuncInterp: %6d  InterpretedHighPri: %6d \n"),
                interpretedCount, maxFuncInterpret, interpretedCallsHighPri);
            Output::Print(_u("** ZeroInterpretedFunctions: %6d OneInterpretedFunctions: %6d ZeroInterpretedWithNonZeroBytecode: %6d \n "), zeroInterpretedFunctions, oneInterpretedFunctions, nonZeroBytecodeFunctions);
            Output::Print(_u("** %-24s : %-10s %-10s %-10s %-10s %-10s\n"), _u("InterpretedCounts"), _u("Total"), _u("NativeCode"), _u("Used"), _u("Usage"), _u("Rejits"));
            uint low = 0;
            uint high = 0;
            for (uint i = 0; i < _countof(totalBuckets); i++)
            {
                low = high;
                if (i <= size1CutOffbucketId)
                {
                    high = low + bucketSize1;
                }
                else if (i < (_countof(totalBuckets) - 1))
                {
                    high = low + bucketSize2;               }
                else
                {
                    high = 100000;
                }
                Output::Print(_u("** %10d - %10d : %10d %10d %10d %7.2f %10d\n"), low, high, totalBuckets[i], nativeCodeBuckets[i], usedNativeCodeBuckets[i], ((float)usedNativeCodeBuckets[i] / nativeCodeBuckets[i]) * 100, rejits[i]);
            }
            Output::Print(_u("\n\n"));
        }
#undef MAX_BUCKETS
#endif

#ifdef REJIT_STATS
        if (PHASE_STATS1(Js::ReJITPhase))
        {
            uint totalBailouts = 0;
            uint totalRejits = 0;
            WCHAR buf[256];

            // Dump bailout data.
            Output::Print(_u("%-40s %6s\n"), _u("Bailout Reason,"), _u("Count"));

            bailoutReasonCounts->Map([&totalBailouts](uint kind, uint val) {
                WCHAR buf[256];
                totalBailouts += val;
                if (val != 0)
                {
                    swprintf_s(buf, _u("%S,"), GetBailOutKindName((IR::BailOutKind)kind));
                    Output::Print(_u("%-40s %6d\n"), buf, val);
                }
            });


            Output::Print(_u("%-40s %6d\n"), _u("TOTAL,"), totalBailouts);
            Output::Print(_u("\n\n"));

            // Dump rejit data.
            Output::Print(_u("%-40s %6s\n"), _u("Rejit Reason,"), _u("Count"));
            for (uint i = 0; i < NumRejitReasons; ++i)
            {
                totalRejits += rejitReasonCounts[i];
                if (rejitReasonCounts[i] != 0)
                {
                    swprintf_s(buf, _u("%S,"), RejitReasonNames[i]);
                    Output::Print(_u("%-40s %6d\n"), buf, rejitReasonCounts[i]);
                }
            }
            Output::Print(_u("%-40s %6d\n"), _u("TOTAL,"), totalRejits);
            Output::Print(_u("\n\n"));

            // If in verbose mode, dump data for each FunctionBody
            if (CONFIG_FLAG(Verbose) && rejitStatsMap != nullptr)
            {
                // Aggregated data
                Output::Print(_u("%-30s %14s %14s\n"), _u("Function (#),"), _u("Bailout Count,"), _u("Rejit Count"));
                rejitStatsMap->Map([](Js::FunctionBody const *body, RejitStats *stats, RecyclerWeakReference<const Js::FunctionBody> const*) {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    for (uint i = 0; i < NumRejitReasons; ++i)
                        stats->m_totalRejits += stats->m_rejitReasonCounts[i];

                    stats->m_bailoutReasonCounts->Map([stats](uint kind, uint val) {
                        stats->m_totalBailouts += val;
                    });

                    WCHAR buf[256];

                    swprintf_s(buf, _u("%s (%s),"), body->GetExternalDisplayName(), (const_cast<Js::FunctionBody*>(body))->GetDebugNumberSet(debugStringBuffer)); //TODO Kount
                    Output::Print(_u("%-30s %14d, %14d\n"), buf, stats->m_totalBailouts, stats->m_totalRejits);

                });
                Output::Print(_u("\n\n"));

                // Per FunctionBody data
                rejitStatsMap->Map([](Js::FunctionBody const *body, RejitStats *stats, RecyclerWeakReference<const Js::FunctionBody> const *) {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    WCHAR buf[256];

                    swprintf_s(buf, _u("%s (%s),"), body->GetExternalDisplayName(), (const_cast<Js::FunctionBody*>(body))->GetDebugNumberSet(debugStringBuffer)); //TODO Kount
                    Output::Print(_u("%-30s\n\n"), buf);

                    // Dump bailout data
                    if (stats->m_totalBailouts != 0)
                    {
                        Output::Print(_u("%10sBailouts:\n"), _u(""));

                        stats->m_bailoutReasonCounts->Map([](uint kind, uint val) {
                            if (val != 0)
                            {
                                WCHAR buf[256];
                                swprintf_s(buf, _u("%S,"), GetBailOutKindName((IR::BailOutKind)kind));
                                Output::Print(_u("%10s%-40s %6d\n"), _u(""), buf, val);
                            }
                        });
                    }
                    Output::Print(_u("\n"));

                    // Dump rejit data.
                    if (stats->m_totalRejits != 0)
                    {
                        Output::Print(_u("%10sRejits:\n"), _u(""));
                        for (uint i = 0; i < NumRejitReasons; ++i)
                        {
                            if (stats->m_rejitReasonCounts[i] != 0)
                            {
                                swprintf_s(buf, _u("%S,"), RejitReasonNames[i]);
                                Output::Print(_u("%10s%-40s %6d\n"), _u(""), buf, stats->m_rejitReasonCounts[i]);
                            }
                        }
                        Output::Print(_u("\n\n"));
                    }
                });

            }
        }

        this->ClearBailoutReasonCountsMap();
        this->ClearRejitReasonCountsArray();
#endif

#ifdef FIELD_ACCESS_STATS
    if (PHASE_STATS1(Js::ObjTypeSpecPhase))
    {
        FieldAccessStats globalStats;
        if (this->fieldAccessStatsByFunctionNumber != nullptr)
        {
            this->fieldAccessStatsByFunctionNumber->Map([&globalStats](uint functionNumber, FieldAccessStatsEntry* entry)
            {
                FieldAccessStats functionStats;
                entry->stats.Map([&functionStats](FieldAccessStatsPtr entryPointStats)
                {
                    functionStats.Add(entryPointStats);
                });

                if (PHASE_VERBOSE_STATS1(Js::ObjTypeSpecPhase))
                {
                    FunctionBody* functionBody = entry->functionBodyWeakRef->Get();
                    const char16* functionName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                    Output::Print(_u("FieldAccessStats: function %s (#%u): inline cache stats:\n"), functionName, functionNumber);
                    Output::Print(_u("    overall: total %u, no profile info %u\n"), functionStats.totalInlineCacheCount, functionStats.noInfoInlineCacheCount);
                    Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
                        functionStats.monoInlineCacheCount, functionStats.emptyMonoInlineCacheCount, functionStats.clonedMonoInlineCacheCount);
                    Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
                        functionStats.polyInlineCacheCount, functionStats.highUtilPolyInlineCacheCount, functionStats.lowUtilPolyInlineCacheCount,
                        functionStats.nullPolyInlineCacheCount, functionStats.emptyPolyInlineCacheCount, functionStats.ignoredPolyInlineCacheCount, functionStats.disabledPolyInlineCacheCount,
                        functionStats.equivPolyInlineCacheCount, functionStats.nonEquivPolyInlineCacheCount, functionStats.clonedPolyInlineCacheCount);
                }

                globalStats.Add(&functionStats);
            });
        }

        Output::Print(_u("FieldAccessStats: totals\n"));
        Output::Print(_u("    overall: total %u, no profile info %u\n"), globalStats.totalInlineCacheCount, globalStats.noInfoInlineCacheCount);
        Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
            globalStats.monoInlineCacheCount, globalStats.emptyMonoInlineCacheCount, globalStats.clonedMonoInlineCacheCount);
        Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
            globalStats.polyInlineCacheCount, globalStats.highUtilPolyInlineCacheCount, globalStats.lowUtilPolyInlineCacheCount,
            globalStats.nullPolyInlineCacheCount, globalStats.emptyPolyInlineCacheCount, globalStats.ignoredPolyInlineCacheCount, globalStats.disabledPolyInlineCacheCount,
            globalStats.equivPolyInlineCacheCount, globalStats.nonEquivPolyInlineCacheCount, globalStats.clonedPolyInlineCacheCount);
    }
#endif

#ifdef MISSING_PROPERTY_STATS
    if (PHASE_STATS1(Js::MissingPropertyCachePhase))
    {
        Output::Print(_u("MissingPropertyStats: hits = %d, misses = %d, cache attempts = %d.\n"),
            this->missingPropertyHits, this->missingPropertyMisses, this->missingPropertyCacheAttempts);
    }
#endif


#ifdef INLINE_CACHE_STATS
        if (PHASE_STATS1(Js::PolymorphicInlineCachePhase))
        {
            Output::Print(_u("%s,%s,%s,%s,%s,%s,%s,%s,%s\n"), _u("Function"), _u("Property"), _u("Kind"), _u("Accesses"), _u("Misses"), _u("Miss Rate"), _u("Collisions"), _u("Collision Rate"), _u("Slot Count"));
            cacheDataMap->Map([this](Js::PolymorphicInlineCache const *cache, InlineCacheData *data) {
                cache->PrintStats(data);
            });
        }
#endif

#if ENABLE_REGEX_CONFIG_OPTIONS
        if (regexStatsDatabase != 0)
            regexStatsDatabase->Print(GetRegexDebugWriter());
#endif
        OUTPUT_STATS(Js::EmitterPhase, _u("Script Context: 0x%p Url: %s\n"), this, this->url);
        OUTPUT_STATS(Js::EmitterPhase, _u("  Total thread committed code size = %d\n"), this->GetThreadContext()->GetCodeSize());

        OUTPUT_STATS(Js::ParsePhase, _u("Script Context: 0x%p Url: %s\n"), this, this->url);
        OUTPUT_STATS(Js::ParsePhase, _u("  Total ThreadContext source size %d\n"), this->GetThreadContext()->GetSourceSize());
#endif

#ifdef ENABLE_BASIC_TELEMETRY
        if (this->telemetry != nullptr)
        {
            // If an exception (e.g. out-of-memory) happens during InitializeAllocations then `this->telemetry` will be null and the Close method will still be called, hence this guard expression.
            this->telemetry->OutputPrint();
        }
#endif

        Output::Flush();
    }